

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

intercept_t * __thiscall FPathTraverse::Next(FPathTraverse *this)

{
  intercept_t *piVar1;
  ulong uVar2;
  intercept_t *piVar3;
  double dVar4;
  
  uVar2 = (ulong)this->intercept_index;
  piVar3 = intercepts.Array + uVar2;
  dVar4 = 3.4028234663852886e+38;
  piVar1 = (intercept_t *)0x0;
  for (; uVar2 < intercepts.Count; uVar2 = uVar2 + 1) {
    if ((piVar3->frac < dVar4) && (piVar3->done == false)) {
      piVar1 = piVar3;
      dVar4 = piVar3->frac;
    }
    piVar3 = piVar3 + 1;
  }
  if (piVar1 == (intercept_t *)0x0 || 1.0 < dVar4) {
    return (intercept_t *)0x0;
  }
  piVar1->done = true;
  return piVar1;
}

Assistant:

intercept_t *FPathTraverse::Next()
{
	intercept_t *in = NULL;

	double dist = FLT_MAX;
	for (unsigned scanpos = intercept_index; scanpos < intercepts.Size (); scanpos++)
	{
		intercept_t *scan = &intercepts[scanpos];
		if (scan->frac < dist && !scan->done)
		{
			dist = scan->frac;
			in = scan;
		}
	}
	
	if (dist > 1. || in == NULL) return NULL;	// checked everything in range			
	in->done = true;
	return in;
}